

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::RadioButton(char *label,bool active)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  undefined7 in_register_00000031;
  char *text;
  ImGuiCol idx;
  char cVar7;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar8;
  bool hovered;
  bool held;
  ImVec2 center;
  ImRect total_bb;
  bool local_aa;
  bool local_a9;
  ImVec2 local_a8;
  undefined4 local_9c;
  undefined1 local_98 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImRect local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_9c = (undefined4)CONCAT71(in_register_00000031,active);
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar2.x;
    local_58._4_4_ = IVar2.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    local_88 = GetFrameHeight();
    local_78.Min.x = (this->DC).CursorPos.x;
    local_78.Min.y = (this->DC).CursorPos.y;
    local_98 = ZEXT416((uint)local_78.Min.x);
    local_68 = ZEXT416((uint)local_78.Min.y);
    fVar8 = 0.0;
    if (0.0 < (float)local_58._0_4_) {
      fVar8 = (pIVar3->Style).ItemInnerSpacing.x + (float)local_58._0_4_;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    local_78.Max.y = text_baseline_y + text_baseline_y + (float)local_58._4_4_ + local_78.Min.y;
    local_78.Max.x = fVar8 + local_88 + local_78.Min.x;
    uStack_84 = extraout_XMM0_Db;
    uStack_80 = extraout_XMM0_Dc_00;
    uStack_7c = extraout_XMM0_Dd_00;
    ItemSize(&local_78,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&local_78,id,(ImRect *)0x0);
    if (bVar4) {
      local_48 = local_88 + (float)local_98._0_4_;
      uStack_44 = uStack_84;
      uStack_40 = uStack_80;
      uStack_3c = uStack_7c;
      local_a8.y = (float)(int)((local_88 + (float)local_68._0_4_ + (float)local_68._0_4_) * 0.5 +
                               0.5);
      local_a8.x = (float)(int)(((float)local_98._0_4_ + local_48) * 0.5 + 0.5);
      local_98._0_4_ = local_88 + -1.0;
      bVar5 = ButtonBehavior(&local_78,id,&local_aa,&local_a9,0);
      cVar7 = (char)local_9c;
      if (bVar5) {
        MarkItemEdited(id);
      }
      local_98._0_4_ = (float)local_98._0_4_ * 0.5;
      RenderNavHighlight(&local_78,id,1);
      pIVar1 = this->DrawList;
      if ((local_a9 != true) || (idx = 9, local_aa == false)) {
        idx = local_aa + 7;
      }
      IVar6 = GetColorU32(idx,1.0);
      ImDrawList::AddCircleFilled(pIVar1,&local_a8,(float)local_98._0_4_,IVar6,0x10);
      if (cVar7 != '\0') {
        fVar8 = 1.0;
        if (1.0 <= (float)(int)(local_88 / 6.0)) {
          fVar8 = (float)(int)(local_88 / 6.0);
        }
        pIVar1 = this->DrawList;
        local_88 = (float)local_98._0_4_ - fVar8;
        IVar6 = GetColorU32(0x12,1.0);
        ImDrawList::AddCircleFilled(pIVar1,&local_a8,local_88,IVar6,0x10);
      }
      if (0.0 < (pIVar3->Style).FrameBorderSize) {
        pIVar1 = this->DrawList;
        local_38.y = local_a8.y + 1.0;
        local_38.x = local_a8.x + 1.0;
        IVar6 = GetColorU32(6,1.0);
        cVar7 = (char)local_9c;
        ImDrawList::AddCircle
                  (pIVar1,&local_38,(float)local_98._0_4_,IVar6,0x10,(pIVar3->Style).FrameBorderSize
                  );
        pIVar1 = this->DrawList;
        IVar6 = GetColorU32(5,1.0);
        ImDrawList::AddCircle
                  (pIVar1,&local_a8,(float)local_98._0_4_,IVar6,0x10,(pIVar3->Style).FrameBorderSize
                  );
      }
      if (pIVar3->LogEnabled == true) {
        text = "( )";
        if (cVar7 != '\0') {
          text = "(x)";
        }
        LogRenderedText(&local_78.Min,text,(char *)0x0);
      }
      if (0.0 < (float)local_58._0_4_) {
        IVar2.y = (float)local_68._0_4_ + (pIVar3->Style).FramePadding.y;
        IVar2.x = local_48 + (pIVar3->Style).ItemInnerSpacing.x;
        RenderText(IVar2,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}